

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg.c
# Opt level: O0

int cvNlsFPFunctionSensStg(N_Vector ycorStg,N_Vector resStg,void *cvode_mem)

{
  void *pvVar1;
  N_Vector in_RDX;
  N_Vector *in_RSI;
  N_Vector in_RDI;
  sunrealtype unaff_retaddr;
  N_Vector *resS;
  N_Vector *ycorS;
  int is;
  int retval;
  CVodeMem cv_mem;
  int local_30;
  N_Vector fScur;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RDX == (N_Vector)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x1b0,"cvNlsFPFunctionSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"cvode_mem = NULL illegal.");
    iVar2 = -0x15;
  }
  else {
    pvVar1 = (*in_RSI)->content;
    fScur = in_RDX;
    iVar2 = N_VLinearSumVectorArray
                      (0x3ff0000000000000,*(undefined4 *)&in_RDX[6].content,in_RDX[0x1b].content,
                       *in_RDI->content,in_RDX[0x1f].sunctx);
    if (iVar2 == 0) {
      iVar2 = cvSensRhsWrapper((CVodeMem)resS,unaff_retaddr,
                               (N_Vector)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               in_RSI,(N_Vector *)fScur,in_RDX,(N_Vector)cv_mem);
      if (iVar2 < 0) {
        iVar2 = -0x29;
      }
      else if (iVar2 < 1) {
        for (local_30 = 0; local_30 < *(int *)&in_RDX[6].content; local_30 = local_30 + 1) {
          N_VLinearSum(in_RDX[0x29].ops,0xbff0000000000000,
                       *(undefined8 *)((long)pvVar1 + (long)local_30 * 8),
                       (&(in_RDX[0x1b].ops)->nvgetvectorid)[local_30],
                       *(undefined8 *)((long)pvVar1 + (long)local_30 * 8));
          N_VScale(in_RDX[0x36].sunctx,*(undefined8 *)((long)pvVar1 + (long)local_30 * 8),
                   *(undefined8 *)((long)pvVar1 + (long)local_30 * 8));
        }
        iVar2 = 0;
      }
      else {
        iVar2 = 0xf;
      }
    }
    else {
      iVar2 = -0x1c;
    }
  }
  return iVar2;
}

Assistant:

static int cvNlsFPFunctionSensStg(N_Vector ycorStg, N_Vector resStg,
                                  void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval, is;
  N_Vector *ycorS, *resS;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* extract sensitivity and residual vectors from the vector wrapper */
  ycorS = NV_VECS_SW(ycorStg);
  resS  = NV_VECS_SW(resStg);

  /* update the sensitivities based on the current correction */
  retval = N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znS[0], ONE,
                                   ycorS, cv_mem->cv_yS);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* evaluate the sensitivity rhs function */
  retval = cvSensRhsWrapper(cv_mem, cv_mem->cv_tn, cv_mem->cv_y,
                            cv_mem->cv_ftemp, cv_mem->cv_yS, resS,
                            cv_mem->cv_vtemp1, cv_mem->cv_vtemp2);

  if (retval < 0) { return (CV_SRHSFUNC_FAIL); }
  if (retval > 0) { return (SRHSFUNC_RECVR); }

  /* evaluate sensitivity fixed point function */
  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    N_VLinearSum(cv_mem->cv_h, resS[is], -ONE, cv_mem->cv_znS[1][is], resS[is]);
    N_VScale(cv_mem->cv_rl1, resS[is], resS[is]);
  }

  return (CV_SUCCESS);
}